

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Parser *__return_storage_ptr___00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Opt local_2790;
  Parser local_2718;
  Parser local_26b8;
  Parser local_2658;
  Parser local_25f8;
  Parser local_2598;
  Parser local_2538;
  Parser local_24d8;
  Parser local_2478;
  Parser local_2418;
  Parser local_23b8;
  Parser local_2358;
  Parser local_22f8;
  Parser local_2298;
  Parser local_2238;
  Parser local_21d8;
  Parser local_2178;
  Parser local_2118;
  Parser local_20b8;
  Parser local_2058;
  Parser local_1ff8;
  Parser local_1f98;
  Parser local_1f38;
  Parser local_1ed8;
  Parser local_1e78;
  Parser local_1e18;
  Parser local_1db8;
  Parser local_1d58;
  Parser local_1cf8;
  Parser local_1c98;
  Parser local_1c38;
  Parser local_1bd8;
  undefined1 local_1b78 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b18;
  undefined1 local_1b00 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1aa0;
  undefined1 local_1a88 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a28;
  undefined1 local_1a10 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19b0;
  undefined1 local_1998 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1938;
  undefined1 local_1920 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18c0;
  undefined1 local_18a8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1848;
  undefined1 local_1830 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17d0;
  undefined1 local_17b8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1758;
  undefined1 local_1740 [96];
  undefined1 local_16e0 [64];
  string local_16a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1680;
  undefined1 local_1668 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1660 [7];
  string local_1628 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1608;
  undefined1 local_15f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_15e8 [7];
  string local_15b0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1590;
  undefined1 local_1578 [64];
  string local_1538 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1518;
  undefined1 local_1500 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_14f8 [7];
  string local_14c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14a0;
  undefined1 local_1488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1480 [7];
  string local_1448 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1428;
  undefined1 local_1410 [8];
  __allocator_type __a2_10;
  string local_13d0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13b0;
  undefined1 local_1398 [8];
  __allocator_type __a2_4;
  string local_1358 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1338;
  undefined1 local_1320 [8];
  __allocator_type __a2_9;
  string local_12e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12c0;
  undefined1 auStack_12a8 [8];
  __allocator_type __a2_2;
  string local_1268 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1248;
  undefined1 auStack_1230 [8];
  __allocator_type __a2_7;
  string local_11f0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11d0;
  undefined1 local_11b8 [64];
  _Alloc_hider local_1178;
  size_type local_1170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1158;
  undefined1 local_1140 [8];
  __allocator_type __a2_5;
  string local_1120 [32];
  _Alloc_hider local_1100;
  size_type local_10f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10e0;
  undefined1 local_10c8 [8];
  __allocator_type __a2_6;
  string local_10a8 [32];
  _Alloc_hider local_1088;
  size_type local_1080;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1078;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1068;
  undefined1 local_1050 [8];
  pointer local_1048;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1040;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1038;
  string local_1030 [32];
  _Alloc_hider local_1010;
  size_type local_1008;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1000;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ff0;
  ExeName local_fd8;
  undefined1 local_fb0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_fa8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_fa0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f98;
  string local_f90 [32];
  _Alloc_hider local_f70;
  size_type local_f68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f50;
  undefined1 auStack_f38 [8];
  __allocator_type __a2_3;
  string local_f18 [32];
  _Alloc_hider local_ef8;
  size_type local_ef0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ee8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ed8;
  undefined1 local_ec0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_eb8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_eb0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea8;
  string local_ea0 [32];
  _Alloc_hider local_e80;
  size_type local_e78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e60;
  undefined1 auStack_e48 [8];
  __allocator_type __a2_8;
  string local_e28 [32];
  _Alloc_hider local_e08;
  size_type local_e00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_df8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_de8;
  undefined1 auStack_dd0 [8];
  __allocator_type __a2_1;
  string local_db0 [32];
  _Alloc_hider local_d90;
  size_type local_d88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d70;
  undefined1 local_d58 [8];
  __allocator_type __a2;
  string local_d38 [32];
  _Alloc_hider local_d18;
  size_type local_d10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_cf8;
  value_type local_ce0;
  value_type local_cc0;
  string local_ca0 [32];
  value_type local_c80;
  value_type local_c60;
  string local_c40 [32];
  value_type local_c20;
  value_type local_c00;
  string local_be0 [32];
  value_type local_bc0;
  value_type local_ba0;
  string local_b80 [32];
  value_type local_b60;
  value_type local_b40;
  string local_b20 [32];
  value_type local_b00;
  value_type local_ae0;
  string local_ac0 [32];
  string local_aa0;
  value_type local_a80;
  value_type local_a60;
  string local_a40 [32];
  string local_a20 [32];
  value_type local_a00;
  value_type local_9e0;
  string local_9c0 [32];
  string local_9a0;
  value_type local_980;
  value_type local_960;
  string local_940 [32];
  value_type local_920;
  value_type local_900;
  string local_8e0 [32];
  string local_8c0 [32];
  value_type local_8a0;
  value_type local_880;
  string local_860 [32];
  string local_840 [32];
  value_type local_820;
  value_type local_800;
  string local_7e0 [32];
  string local_7c0 [32];
  value_type local_7a0;
  value_type local_780;
  string local_760 [32];
  string local_740;
  value_type local_720;
  value_type local_700;
  string local_6e0 [32];
  string local_6c0 [32];
  value_type local_6a0;
  value_type local_680;
  string local_660 [32];
  value_type local_640;
  value_type local_620;
  string local_600 [32];
  string local_5e0;
  value_type local_5c0;
  value_type local_5a0;
  string local_580 [32];
  string local_560 [32];
  value_type local_540;
  value_type local_520;
  string local_500 [32];
  value_type local_4e0;
  string local_4c0 [32];
  value_type local_4a0;
  string local_480 [32];
  string local_460 [32];
  value_type local_440;
  string local_420 [32];
  string local_400 [32];
  value_type local_3e0;
  string local_3c0 [32];
  string local_3a0 [32];
  value_type local_380;
  string local_360 [32];
  value_type local_340;
  string local_320 [32];
  string local_300 [32];
  value_type local_2e0;
  string local_2c0 [32];
  string local_2a0;
  value_type local_280;
  string local_260 [32];
  string local_240;
  value_type local_220;
  string local_200 [32];
  string local_1e0;
  value_type local_1c0;
  string local_1a0 [32];
  value_type local_180;
  string local_160 [32];
  string local_140;
  value_type local_120;
  string local_100 [32];
  string local_e0;
  string local_c0 [32];
  Parser *local_a0;
  allocator<char> local_92;
  allocator<char> local_91;
  allocator<char> local_90;
  allocator<char> local_8f;
  allocator<char> local_8e;
  allocator<char> local_8d;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  allocator<char> local_88;
  allocator<char> local_87;
  allocator<char> local_86;
  allocator<char> local_85;
  allocator<char> local_84;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  allocator<char> local_80;
  allocator<char> local_7f;
  allocator<char> local_7e;
  allocator<char> local_7d;
  allocator<char> local_7c;
  allocator<char> local_7b;
  allocator<char> local_7a;
  allocator<char> local_79;
  allocator<char> local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75;
  allocator<char> local_74;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d;
  allocator<char> local_6c;
  allocator<char> local_6b;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  clara::detail::ExeName::ExeName(&local_fd8,&config->processName);
  clara::detail::Help::Help((Help *)&local_2790,&config->showHelp);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (&local_1bd8,&local_fd8.super_ComposableParserImpl<Catch::clara::detail::ExeName>,
             (Help *)&local_2790);
  clara::detail::Opt::Opt((Opt *)local_1b78,&config->listTests);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce0,"-l",&local_92);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1b18,&local_ce0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc0,"--list-tests",&local_91);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1b18,&local_cc0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ca0,"list all/matching test cases",&local_90);
  std::__cxx11::string::_M_assign((string *)(local_1b78 + 0x40));
  clara::detail::Parser::operator|(&local_1c38,&local_1bd8,(Opt *)local_1b78);
  clara::detail::Opt::Opt((Opt *)local_1b00,&config->listTags);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c80,"-t",&local_8f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1aa0,&local_c80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c60,"--list-tags",&local_8e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1aa0,&local_c60);
  std::__cxx11::string::string<std::allocator<char>>(local_c40,"list all/matching tags",&local_8d);
  std::__cxx11::string::_M_assign((string *)(local_1b00 + 0x40));
  clara::detail::Parser::operator|(&local_1c98,&local_1c38,(Opt *)local_1b00);
  clara::detail::Opt::Opt((Opt *)local_1a88,&config->showSuccessfulTests);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c20,"-s",&local_8c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a28,&local_c20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c00,"--success",&local_8b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a28,&local_c00);
  std::__cxx11::string::string<std::allocator<char>>
            (local_be0,"include successful tests in output",&local_8a);
  std::__cxx11::string::_M_assign((string *)(local_1a88 + 0x40));
  clara::detail::Parser::operator|(&local_1cf8,&local_1c98,(Opt *)local_1a88);
  clara::detail::Opt::Opt((Opt *)local_1a10,&config->shouldDebugBreak);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bc0,"-b",&local_89);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_19b0,&local_bc0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"--break",&local_88);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_19b0,&local_ba0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b80,"break into debugger on failure",&local_87);
  std::__cxx11::string::_M_assign((string *)(local_1a10 + 0x40));
  clara::detail::Parser::operator|(&local_1d58,&local_1cf8,(Opt *)local_1a10);
  clara::detail::Opt::Opt((Opt *)local_1998,&config->noThrow);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b60,"-e",&local_86);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1938,&local_b60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b40,"--nothrow",&local_85);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1938,&local_b40);
  std::__cxx11::string::string<std::allocator<char>>(local_b20,"skip exception tests",&local_84);
  std::__cxx11::string::_M_assign((string *)(local_1998 + 0x40));
  clara::detail::Parser::operator|(&local_1db8,&local_1d58,(Opt *)local_1998);
  clara::detail::Opt::Opt((Opt *)local_1920,&config->showInvisibles);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b00,"-i",&local_83);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18c0,&local_b00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae0,"--invisibles",&local_82);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_18c0,&local_ae0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac0,"show invisibles (tabs, newlines)",&local_81);
  std::__cxx11::string::_M_assign((string *)(local_1920 + 0x40));
  clara::detail::Parser::operator|(&local_1e18,&local_1db8,(Opt *)local_1920);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa0,"filename",&local_80);
  clara::detail::Opt::Opt<std::__cxx11::string>
            ((Opt *)local_18a8,&config->outputFilename,&local_aa0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a80,"-o",&local_7f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1848,&local_a80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a60,"--out",&local_7e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1848,&local_a60);
  std::__cxx11::string::string<std::allocator<char>>(local_a40,"output filename",&local_7d);
  std::__cxx11::string::_M_assign((string *)(local_18a8 + 0x40));
  clara::detail::Parser::operator|(&local_1e78,&local_1e18,(Opt *)local_18a8);
  std::__cxx11::string::string<std::allocator<char>>(local_a20,"name",&local_7c);
  local_11b8._0_8_ = &PTR__ParserRefImpl_002186b0;
  local_11b8._8_4_ = Optional;
  local_a0 = __return_storage_ptr__;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_16e0._0_8_ = local_d58;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00217710;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00217760;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  local_16e0._8_8_ = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9802:34)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9802:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9802:34)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9802:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_16e0);
  local_1668 = (undefined1  [8])0x0;
  a_Stack_1660[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_11b8._16_8_ = p_Var1 + 1;
  local_11b8._24_8_ = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1660);
  std::__cxx11::string::string((string *)(local_11b8 + 0x20),local_a20);
  local_1178._M_p = (pointer)&local_1168;
  local_1170 = 0;
  local_1168._M_local_buf[0] = '\0';
  local_11b8._0_8_ = &PTR__Opt_002185c0;
  local_1158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1158.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a00,"-r",&local_7b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1158,&local_a00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e0,"--reporter",&local_7a);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1158,&local_9e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c0,"reporter to use (defaults to console)",&local_79);
  std::__cxx11::string::_M_assign((string *)&local_1178);
  clara::detail::Parser::operator|(&local_1ed8,&local_1e78,(Opt *)local_11b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"name",&local_78);
  clara::detail::Opt::Opt<std::__cxx11::string>((Opt *)local_16e0,&config->name,&local_9a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"-n",&local_77);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1680,&local_980);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"--name",&local_76);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1680,&local_960);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"suite name",&local_75);
  std::__cxx11::string::_M_assign(local_16a0);
  clara::detail::Parser::operator|(&local_1f38,&local_1ed8,(Opt *)local_16e0);
  p_Var2 = (pointer)operator_new(0x20);
  local_d58 = (undefined1  [8])auStack_dd0;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002177b0;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_00217800;
  *(ConfigData **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = config;
  ___a2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9845:19)>,_std::allocator<Catch::clara::detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9845:19)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9845:19)>,_std::allocator<Catch::clara::detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9845:19)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_d58);
  local_fb0 = (undefined1  [8])0x0;
  _Stack_fa8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d58 = (undefined1  [8])&p_Var2->_M_impl;
  ___a2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_1668,
             (shared_ptr<Catch::clara::detail::BoundRef> *)local_d58);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__a2);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_fa8);
  local_1668 = (undefined1  [8])&PTR__Opt_002185c0;
  local_1608.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1608.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1608.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"-a",&local_74);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1608,&local_920);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"--abort",&local_73);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1608,&local_900);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"abort at first failure",&local_72);
  std::__cxx11::string::_M_assign(local_1628);
  clara::detail::Parser::operator|(&local_1f98,&local_1f38,(Opt *)local_1668);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"no. failures",&local_71);
  local_d58 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  ___a2 = ___a2 & 0xffffffff00000000;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_fb0 = (undefined1  [8])auStack_12a8;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00217850;
  puVar3[2] = &PTR__BoundRef_002178a0;
  puVar3[3] = config;
  _Stack_fa8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9848:19)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9848:19)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9848:19)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9848:19)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_fb0);
  auStack_dd0 = (undefined1  [8])0x0;
  ___a2_1 = (pointer)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__a2_1);
  std::__cxx11::string::string(local_d38,local_8c0);
  local_d18._M_p = (pointer)&local_d08;
  local_d10 = 0;
  local_d08._M_local_buf[0] = '\0';
  local_d58 = (undefined1  [8])&PTR__Opt_002185c0;
  local_cf8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_cf8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_cf8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"-x",&local_70);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_cf8,&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"--abortx",&local_6f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_cf8,&local_880);
  std::__cxx11::string::string<std::allocator<char>>(local_860,"abort after x failures",&local_6e);
  std::__cxx11::string::_M_assign((string *)&local_d18);
  clara::detail::Parser::operator|(&local_1ff8,&local_1f98,(Opt *)local_d58);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"warning name",&local_6d);
  local_fb0 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  _Stack_fa8._M_pi = _Stack_fa8._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  auStack_dd0 = (undefined1  [8])auStack_f38;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002178f0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00217940;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  ___a2_1 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9709:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9709:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9709:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9709:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)auStack_dd0);
  auStack_12a8 = (undefined1  [8])0x0;
  ___a2_2 = (pointer)0x0;
  local_fa0 = p_Var1 + 1;
  local_f98._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__a2_2);
  std::__cxx11::string::string(local_f90,local_840);
  local_f70._M_p = (pointer)&local_f60;
  local_f68 = 0;
  local_f60._M_local_buf[0] = '\0';
  local_fb0 = (undefined1  [8])&PTR__Opt_002185c0;
  local_f50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f50.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"-w",&local_6c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f50,&local_820);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"--warn",&local_6b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f50,&local_800);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"enable warnings",&local_6a);
  std::__cxx11::string::_M_assign((string *)&local_f70);
  clara::detail::Parser::operator|(&local_2058,&local_1ff8,(Opt *)local_fb0);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"yes|no",&local_69);
  auStack_dd0 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  ___a2_1 = (pointer)((ulong)___a2_1 & 0xffffffff00000000);
  puVar3 = (undefined8 *)operator_new(0x20);
  auStack_12a8 = (undefined1  [8])local_1398;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00217990;
  puVar3[2] = &PTR__BoundRef_002179e0;
  puVar3[3] = config;
  ___a2_2 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9854:19)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9854:19)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9854:19)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9854:19)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)auStack_12a8);
  auStack_f38 = (undefined1  [8])0x0;
  ___a2_3 = 0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__a2_3);
  std::__cxx11::string::string(local_db0,local_7c0);
  local_d90._M_p = (pointer)&local_d80;
  local_d88 = 0;
  local_d80._M_local_buf[0] = '\0';
  auStack_dd0 = (undefined1  [8])&PTR__Opt_002185c0;
  local_d70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"-d",&local_68);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d70,&local_7a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"--durations",&local_67);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d70,&local_780);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"show test durations",&local_66);
  std::__cxx11::string::_M_assign((string *)&local_d90);
  clara::detail::Parser::operator|(&local_20b8,&local_2058,(Opt *)auStack_dd0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_740,"seconds",&local_65);
  clara::detail::Opt::Opt<double>((Opt *)auStack_12a8,&config->minDuration,&local_740);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"-D",&local_64);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1248,&local_720);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_700,"--min-duration",&local_63);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1248,&local_700);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,"show test durations for tests taking at least the given number of seconds",
             &local_62);
  std::__cxx11::string::_M_assign(local_1268);
  clara::detail::Parser::operator|(&local_2118,&local_20b8,(Opt *)auStack_12a8);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"filename",&local_61);
  auStack_f38 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  ___a2_3 = ___a2_3 & 0xffffffff00000000;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_1398 = (undefined1  [8])local_1140;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00217a30;
  puVar3[2] = &PTR__BoundRef_00217a80;
  puVar3[3] = config;
  ___a2_4 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9725:44)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9725:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9725:44)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9725:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1398);
  local_15f0 = (undefined1  [8])0x0;
  a_Stack_15e8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_15e8);
  std::__cxx11::string::string(local_f18,local_6c0);
  local_ef8._M_p = (pointer)&local_ee8;
  local_ef0 = 0;
  local_ee8._M_local_buf[0] = '\0';
  auStack_f38 = (undefined1  [8])&PTR__Opt_002185c0;
  local_ed8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ed8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ed8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"-f",&local_60);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ed8,&local_6a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"--input-file",&local_5f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ed8,&local_680);
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,"load test names to run from a file",&local_5e);
  std::__cxx11::string::_M_assign((string *)&local_ef8);
  clara::detail::Parser::operator|(&local_2178,&local_2118,(Opt *)auStack_f38);
  clara::detail::Opt::Opt((Opt *)local_1398,&config->filenamesAsTags);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"-#",&local_5d);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1338,&local_640);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"--filenames-as-tags",&local_5c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1338,&local_620);
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,"adds a tag for the filename",&local_5b);
  std::__cxx11::string::_M_assign(local_1358);
  clara::detail::Parser::operator|(&local_21d8,&local_2178,(Opt *)local_1398);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"section name",&local_5a);
  clara::detail::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Opt *)local_15f0,&config->sectionsToRun,&local_5e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"-c",&local_59);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1590,&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"--section",&local_58);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1590,&local_5a0);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"specify section to run",&local_57);
  std::__cxx11::string::_M_assign(local_15b0);
  clara::detail::Parser::operator|(&local_2238,&local_21d8,(Opt *)local_15f0);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"quiet|normal|high",&local_56);
  local_1140 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  ___a2_5 = Optional;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_1578._0_8_ = local_10c8;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00217ad0;
  puVar3[2] = &PTR__BoundRef_00217b20;
  puVar3[3] = config;
  local_1578._8_8_ = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9790:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9790:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9790:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9790:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1578);
  local_1500 = (undefined1  [8])0x0;
  a_Stack_14f8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_14f8);
  std::__cxx11::string::string(local_1120,local_560);
  local_1100._M_p = (pointer)&local_10f0;
  local_10f8 = 0;
  local_10f0._M_local_buf[0] = '\0';
  local_1140 = (undefined1  [8])&PTR__Opt_002185c0;
  local_10e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_10e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10e0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"-v",&local_55);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10e0,&local_540);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"--verbosity",&local_54);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10e0,&local_520);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"set output verbosity",&local_53);
  std::__cxx11::string::_M_assign((string *)&local_1100);
  clara::detail::Parser::operator|(&local_2298,&local_2238,(Opt *)local_1140);
  clara::detail::Opt::Opt((Opt *)local_1578,&config->listTestNamesOnly);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"--list-test-names-only",&local_52);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1518,&local_4e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,"list all/matching test cases names only",&local_51);
  std::__cxx11::string::_M_assign(local_1538);
  clara::detail::Parser::operator|(&local_22f8,&local_2298,(Opt *)local_1578);
  clara::detail::Opt::Opt((Opt *)local_1500,&config->listReporters);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"--list-reporters",&local_50);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14a0,&local_4a0);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"list all reporters",&local_4f);
  std::__cxx11::string::_M_assign(local_14c0);
  clara::detail::Parser::operator|(&local_2358,&local_22f8,(Opt *)local_1500);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"decl|lex|rand",&local_4e);
  local_10c8 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  ___a2_6 = Optional;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_1050 = (undefined1  [8])auStack_1230;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00217b70;
  puVar3[2] = &PTR__BoundRef_00217bc0;
  puVar3[3] = config;
  local_1048 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9746:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9746:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9746:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9746:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1050);
  local_ec0 = (undefined1  [8])0x0;
  _Stack_eb8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_eb8);
  std::__cxx11::string::string(local_10a8,local_460);
  local_1088._M_p = (pointer)&local_1078;
  local_1080 = 0;
  local_1078._M_local_buf[0] = '\0';
  local_10c8 = (undefined1  [8])&PTR__Opt_002185c0;
  local_1068.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1068.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1068.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"--order",&local_4d);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1068,&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            (local_420,"test case order (defaults to decl)",&local_4c);
  std::__cxx11::string::_M_assign((string *)&local_1088);
  clara::detail::Parser::operator|(&local_23b8,&local_2358,(Opt *)local_10c8);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"\'time\'|number",&local_4b);
  local_1050 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  local_1048 = (pointer)((ulong)local_1048 & 0xffffffff00000000);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_ec0 = (undefined1  [8])auStack_e48;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00217c10;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00217c60;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_eb8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9757:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9757:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9757:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9757:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_ec0);
  auStack_1230 = (undefined1  [8])0x0;
  ___a2_7 = (pointer)0x0;
  local_1040 = p_Var1 + 1;
  local_1038._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__a2_7);
  std::__cxx11::string::string(local_1030,local_400);
  local_1010._M_p = (pointer)&local_1000;
  local_1008 = 0;
  local_1000._M_local_buf[0] = '\0';
  local_1050 = (undefined1  [8])&PTR__Opt_002185c0;
  local_ff0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ff0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ff0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"--rng-seed",&local_4a);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ff0,&local_3e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,"set a specific seed for random numbers",&local_49);
  std::__cxx11::string::_M_assign((string *)&local_1010);
  clara::detail::Parser::operator|(&local_2418,&local_23b8,(Opt *)local_1050);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"yes|no",&local_48);
  local_ec0 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  _Stack_eb8._M_pi = _Stack_eb8._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  auStack_1230 = (undefined1  [8])local_1320;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00217cb0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_00217d00;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  ___a2_7 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9763:37)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9763:37)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9763:37)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9763:37)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)auStack_1230);
  auStack_e48 = (undefined1  [8])0x0;
  ___a2_8 = 0;
  local_eb0 = p_Var1 + 1;
  local_ea8._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__a2_8);
  std::__cxx11::string::string(local_ea0,local_3a0);
  local_e80._M_p = (pointer)&local_e70;
  local_e78 = 0;
  local_e70._M_local_buf[0] = '\0';
  local_ec0 = (undefined1  [8])&PTR__Opt_002185c0;
  local_e60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"--use-colour",&local_47);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e60,&local_380);
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,"should output be colourised",&local_46);
  std::__cxx11::string::_M_assign((string *)&local_e80);
  clara::detail::Parser::operator|(&local_2478,&local_2418,(Opt *)local_ec0);
  clara::detail::Opt::Opt((Opt *)auStack_1230,&config->libIdentify);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"--libidentify",&local_45)
  ;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11d0,&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,"report name and version according to libidentify standard",&local_44);
  std::__cxx11::string::_M_assign(local_11f0);
  clara::detail::Parser::operator|(&local_24d8,&local_2478,(Opt *)auStack_1230);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"never|start|exit|both",&local_43);
  auStack_e48 = (undefined1  [8])&PTR__ParserRefImpl_002186b0;
  ___a2_8 = ___a2_8 & 0xffffffff00000000;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_1320 = (undefined1  [8])local_1410;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_00217d50;
  puVar3[2] = &PTR__BoundRef_00217da0;
  puVar3[3] = config;
  ___a2_9 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9776:41)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/catch2/catch.hpp:9776:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9776:41)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Narase33[P]std_bot_cpp_libs_catch2_catch_hpp:9776:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1320);
  local_1488 = (undefined1  [8])0x0;
  a_Stack_1480[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1480);
  std::__cxx11::string::string(local_e28,local_300);
  local_e08._M_p = (pointer)&local_df8;
  local_e00 = 0;
  local_df8._M_local_buf[0] = '\0';
  auStack_e48 = (undefined1  [8])&PTR__Opt_002185c0;
  local_de8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_de8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_de8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"--wait-for-keypress",&local_42);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_de8,&local_2e0);
  __return_storage_ptr___00 = local_a0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c0,"waits for a keypress before exiting",&local_41);
  std::__cxx11::string::_M_assign((string *)&local_e08);
  clara::detail::Parser::operator|(&local_2538,&local_24d8,(Opt *)auStack_e48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"samples",&local_40);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)local_1320,&config->benchmarkSamples,&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"--benchmark-samples",&local_3f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_12c0,&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,"number of samples to collect (default: 100)",&local_3e);
  std::__cxx11::string::_M_assign(local_12e0);
  clara::detail::Parser::operator|(&local_2598,&local_2538,(Opt *)local_1320);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"resamples",&local_3d);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)local_1488,&config->benchmarkResamples,&local_240);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"--benchmark-resamples",&local_3c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1428,&local_220);
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,"number of resamples for the bootstrap (default: 100000)",&local_3b);
  std::__cxx11::string::_M_assign(local_1448);
  clara::detail::Parser::operator|(&local_25f8,&local_2598,(Opt *)local_1488);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"confidence interval",&local_3a);
  clara::detail::Opt::Opt<double>((Opt *)local_1410,&config->benchmarkConfidenceInterval,&local_1e0)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"--benchmark-confidence-interval",&local_39);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_13b0,&local_1c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
             &local_38);
  std::__cxx11::string::_M_assign(local_13d0);
  clara::detail::Parser::operator|(&local_2658,&local_25f8,(Opt *)local_1410);
  clara::detail::Opt::Opt((Opt *)local_1830,&config->benchmarkNoAnalysis);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"--benchmark-no-analysis",&local_37);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17d0,&local_180);
  std::__cxx11::string::string<std::allocator<char>>
            (local_160,"perform only measurements; do not perform any analysis",&local_36);
  std::__cxx11::string::_M_assign((string *)(local_1830 + 0x40));
  clara::detail::Parser::operator|(&local_26b8,&local_2658,(Opt *)local_1830);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"benchmarkWarmupTime",&local_35);
  clara::detail::Opt::Opt<long>((Opt *)local_17b8,&config->benchmarkWarmupTime,&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"--benchmark-warmup-time",&local_34);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1758,&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"amount of time in milliseconds spent on warming up each test (default: 100)"
             ,&local_33);
  std::__cxx11::string::_M_assign((string *)(local_17b8 + 0x40));
  clara::detail::Parser::operator|(&local_2718,&local_26b8,(Opt *)local_17b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"test name|pattern|tags",&local_32);
  clara::detail::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>>
            ((Arg *)local_1740,&config->testsOrTags,&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"which test or tests to use",&local_31);
  std::__cxx11::string::_M_assign((string *)(local_1740 + 0x40));
  clara::detail::Parser::operator|(__return_storage_ptr___00,&local_2718,(Arg *)local_1740);
  std::__cxx11::string::~string(local_c0);
  clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::~ParserRefImpl
            ((ParserRefImpl<Catch::clara::detail::Arg> *)local_1740);
  std::__cxx11::string::~string((string *)&local_e0);
  clara::detail::Parser::~Parser(&local_2718);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)&local_120);
  clara::detail::Opt::~Opt((Opt *)local_17b8);
  std::__cxx11::string::~string((string *)&local_140);
  clara::detail::Parser::~Parser(&local_26b8);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string((string *)&local_180);
  clara::detail::Opt::~Opt((Opt *)local_1830);
  clara::detail::Parser::~Parser(&local_2658);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  clara::detail::Opt::~Opt((Opt *)local_1410);
  std::__cxx11::string::~string((string *)&local_1e0);
  clara::detail::Parser::~Parser(&local_25f8);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)&local_220);
  clara::detail::Opt::~Opt((Opt *)local_1488);
  std::__cxx11::string::~string((string *)&local_240);
  clara::detail::Parser::~Parser(&local_2598);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string((string *)&local_280);
  clara::detail::Opt::~Opt((Opt *)local_1320);
  std::__cxx11::string::~string((string *)&local_2a0);
  clara::detail::Parser::~Parser(&local_2538);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  clara::detail::Opt::~Opt((Opt *)auStack_e48);
  std::__cxx11::string::~string(local_300);
  clara::detail::Parser::~Parser(&local_24d8);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string((string *)&local_340);
  clara::detail::Opt::~Opt((Opt *)auStack_1230);
  clara::detail::Parser::~Parser(&local_2478);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_380);
  clara::detail::Opt::~Opt((Opt *)local_ec0);
  std::__cxx11::string::~string(local_3a0);
  clara::detail::Parser::~Parser(&local_2418);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  clara::detail::Opt::~Opt((Opt *)local_1050);
  std::__cxx11::string::~string(local_400);
  clara::detail::Parser::~Parser(&local_23b8);
  std::__cxx11::string::~string(local_420);
  std::__cxx11::string::~string((string *)&local_440);
  clara::detail::Opt::~Opt((Opt *)local_10c8);
  std::__cxx11::string::~string(local_460);
  clara::detail::Parser::~Parser(&local_2358);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  clara::detail::Opt::~Opt((Opt *)local_1500);
  clara::detail::Parser::~Parser(&local_22f8);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  clara::detail::Opt::~Opt((Opt *)local_1578);
  clara::detail::Parser::~Parser(&local_2298);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  clara::detail::Opt::~Opt((Opt *)local_1140);
  std::__cxx11::string::~string(local_560);
  clara::detail::Parser::~Parser(&local_2238);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_5c0);
  clara::detail::Opt::~Opt((Opt *)local_15f0);
  std::__cxx11::string::~string((string *)&local_5e0);
  clara::detail::Parser::~Parser(&local_21d8);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_640);
  clara::detail::Opt::~Opt((Opt *)local_1398);
  clara::detail::Parser::~Parser(&local_2178);
  std::__cxx11::string::~string(local_660);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_6a0);
  clara::detail::Opt::~Opt((Opt *)auStack_f38);
  std::__cxx11::string::~string(local_6c0);
  clara::detail::Parser::~Parser(&local_2118);
  std::__cxx11::string::~string(local_6e0);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  clara::detail::Opt::~Opt((Opt *)auStack_12a8);
  std::__cxx11::string::~string((string *)&local_740);
  clara::detail::Parser::~Parser(&local_20b8);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::~string((string *)&local_7a0);
  clara::detail::Opt::~Opt((Opt *)auStack_dd0);
  std::__cxx11::string::~string(local_7c0);
  clara::detail::Parser::~Parser(&local_2058);
  std::__cxx11::string::~string(local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_820);
  clara::detail::Opt::~Opt((Opt *)local_fb0);
  std::__cxx11::string::~string(local_840);
  clara::detail::Parser::~Parser(&local_1ff8);
  std::__cxx11::string::~string(local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_8a0);
  clara::detail::Opt::~Opt((Opt *)local_d58);
  std::__cxx11::string::~string(local_8c0);
  clara::detail::Parser::~Parser(&local_1f98);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  clara::detail::Opt::~Opt((Opt *)local_1668);
  clara::detail::Parser::~Parser(&local_1f38);
  std::__cxx11::string::~string(local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_980);
  clara::detail::Opt::~Opt((Opt *)local_16e0);
  std::__cxx11::string::~string((string *)&local_9a0);
  clara::detail::Parser::~Parser(&local_1ed8);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_a00);
  clara::detail::Opt::~Opt((Opt *)local_11b8);
  std::__cxx11::string::~string(local_a20);
  clara::detail::Parser::~Parser(&local_1e78);
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  clara::detail::Opt::~Opt((Opt *)local_18a8);
  std::__cxx11::string::~string((string *)&local_aa0);
  clara::detail::Parser::~Parser(&local_1e18);
  std::__cxx11::string::~string(local_ac0);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_b00);
  clara::detail::Opt::~Opt((Opt *)local_1920);
  clara::detail::Parser::~Parser(&local_1db8);
  std::__cxx11::string::~string(local_b20);
  std::__cxx11::string::~string((string *)&local_b40);
  std::__cxx11::string::~string((string *)&local_b60);
  clara::detail::Opt::~Opt((Opt *)local_1998);
  clara::detail::Parser::~Parser(&local_1d58);
  std::__cxx11::string::~string(local_b80);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&local_bc0);
  clara::detail::Opt::~Opt((Opt *)local_1a10);
  clara::detail::Parser::~Parser(&local_1cf8);
  std::__cxx11::string::~string(local_be0);
  std::__cxx11::string::~string((string *)&local_c00);
  std::__cxx11::string::~string((string *)&local_c20);
  clara::detail::Opt::~Opt((Opt *)local_1a88);
  clara::detail::Parser::~Parser(&local_1c98);
  std::__cxx11::string::~string(local_c40);
  std::__cxx11::string::~string((string *)&local_c60);
  std::__cxx11::string::~string((string *)&local_c80);
  clara::detail::Opt::~Opt((Opt *)local_1b00);
  clara::detail::Parser::~Parser(&local_1c38);
  std::__cxx11::string::~string(local_ca0);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::__cxx11::string::~string((string *)&local_ce0);
  clara::detail::Opt::~Opt((Opt *)local_1b78);
  clara::detail::Parser::~Parser(&local_1bd8);
  clara::detail::Opt::~Opt(&local_2790);
  clara::detail::ExeName::~ExeName(&local_fd8);
  return __return_storage_ptr___00;
}

Assistant:

clara::Parser makeCommandLineParser(ConfigData& config) {

        using namespace clara;

        auto const setWarning = [&](std::string const& warning) {
            auto warningSet = [&]() {
                if (warning == "NoAssertions")
                    return WarnAbout::NoAssertions;

                if (warning == "NoTests")
                    return WarnAbout::NoTests;

                return WarnAbout::Nothing;
            }();

            if (warningSet == WarnAbout::Nothing)
                return ParserResult::runtimeError("Unrecognised warning: '" + warning + "'");
            config.warnings = static_cast<WarnAbout::What>(config.warnings | warningSet);
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const loadTestNamesFromFile = [&](std::string const& filename) {
            std::ifstream f(filename.c_str());
            if (!f.is_open())
                return ParserResult::runtimeError("Unable to load input file: '" + filename + "'");

            std::string line;
            while (std::getline(f, line)) {
                line = trim(line);
                if (!line.empty() && !startsWith(line, '#')) {
                    if (!startsWith(line, '"'))
                        line = '"' + line + '"';
                    config.testsOrTags.push_back(line);
                    config.testsOrTags.emplace_back(",");
                }
            }
            //Remove comma in the end
            if (!config.testsOrTags.empty())
                config.testsOrTags.erase(config.testsOrTags.end() - 1);

            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setTestOrder = [&](std::string const& order) {
            if (startsWith("declared", order))
                config.runOrder = RunTests::InDeclarationOrder;
            else if (startsWith("lexical", order))
                config.runOrder = RunTests::InLexicographicalOrder;
            else if (startsWith("random", order))
                config.runOrder = RunTests::InRandomOrder;
            else
                return clara::ParserResult::runtimeError("Unrecognised ordering: '" + order + "'");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setRngSeed = [&](std::string const& seed) {
            if (seed != "time")
                return clara::detail::convertInto(seed, config.rngSeed);
            config.rngSeed = static_cast<unsigned int>(std::time(nullptr));
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setColourUsage = [&](std::string const& useColour) {
            auto mode = toLower(useColour);

            if (mode == "yes")
                config.useColour = UseColour::Yes;
            else if (mode == "no")
                config.useColour = UseColour::No;
            else if (mode == "auto")
                config.useColour = UseColour::Auto;
            else
                return ParserResult::runtimeError("colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setWaitForKeypress = [&](std::string const& keypress) {
            auto keypressLc = toLower(keypress);
            if (keypressLc == "never")
                config.waitForKeypress = WaitForKeypress::Never;
            else if (keypressLc == "start")
                config.waitForKeypress = WaitForKeypress::BeforeStart;
            else if (keypressLc == "exit")
                config.waitForKeypress = WaitForKeypress::BeforeExit;
            else if (keypressLc == "both")
                config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
            else
                return ParserResult::runtimeError("keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setVerbosity = [&](std::string const& verbosity) {
            auto lcVerbosity = toLower(verbosity);
            if (lcVerbosity == "quiet")
                config.verbosity = Verbosity::Quiet;
            else if (lcVerbosity == "normal")
                config.verbosity = Verbosity::Normal;
            else if (lcVerbosity == "high")
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError("Unrecognised verbosity, '" + verbosity + "'");
            return ParserResult::ok(ParseResultType::Matched);
        };
        auto const setReporter = [&](std::string const& reporter) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower(reporter);
            auto result = factories.find(lcReporter);

            if (factories.end() != result)
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError("Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters");
            return ParserResult::ok(ParseResultType::Matched);
        };

        auto cli
            = ExeName(config.processName)
            | Help(config.showHelp)
            | Opt(config.listTests)
            ["-l"]["--list-tests"]
            ("list all/matching test cases")
            | Opt(config.listTags)
            ["-t"]["--list-tags"]
            ("list all/matching tags")
            | Opt(config.showSuccessfulTests)
            ["-s"]["--success"]
            ("include successful tests in output")
            | Opt(config.shouldDebugBreak)
            ["-b"]["--break"]
            ("break into debugger on failure")
            | Opt(config.noThrow)
            ["-e"]["--nothrow"]
            ("skip exception tests")
            | Opt(config.showInvisibles)
            ["-i"]["--invisibles"]
            ("show invisibles (tabs, newlines)")
            | Opt(config.outputFilename, "filename")
            ["-o"]["--out"]
            ("output filename")
            | Opt(setReporter, "name")
            ["-r"]["--reporter"]
            ("reporter to use (defaults to console)")
            | Opt(config.name, "name")
            ["-n"]["--name"]
            ("suite name")
            | Opt([&](bool) { config.abortAfter = 1; })
            ["-a"]["--abort"]
            ("abort at first failure")
            | Opt([&](int x) { config.abortAfter = x; }, "no. failures")
            ["-x"]["--abortx"]
            ("abort after x failures")
            | Opt(setWarning, "warning name")
            ["-w"]["--warn"]
            ("enable warnings")
            | Opt([&](bool flag) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no")
            ["-d"]["--durations"]
            ("show test durations")
            | Opt(config.minDuration, "seconds")
            ["-D"]["--min-duration"]
            ("show test durations for tests taking at least the given number of seconds")
            | Opt(loadTestNamesFromFile, "filename")
            ["-f"]["--input-file"]
            ("load test names to run from a file")
            | Opt(config.filenamesAsTags)
            ["-#"]["--filenames-as-tags"]
            ("adds a tag for the filename")
            | Opt(config.sectionsToRun, "section name")
            ["-c"]["--section"]
            ("specify section to run")
            | Opt(setVerbosity, "quiet|normal|high")
            ["-v"]["--verbosity"]
            ("set output verbosity")
            | Opt(config.listTestNamesOnly)
            ["--list-test-names-only"]
        ("list all/matching test cases names only")
            | Opt(config.listReporters)
            ["--list-reporters"]
        ("list all reporters")
            | Opt(setTestOrder, "decl|lex|rand")
            ["--order"]
        ("test case order (defaults to decl)")
            | Opt(setRngSeed, "'time'|number")
            ["--rng-seed"]
        ("set a specific seed for random numbers")
            | Opt(setColourUsage, "yes|no")
            ["--use-colour"]
        ("should output be colourised")
            | Opt(config.libIdentify)
            ["--libidentify"]
        ("report name and version according to libidentify standard")
            | Opt(setWaitForKeypress, "never|start|exit|both")
            ["--wait-for-keypress"]
        ("waits for a keypress before exiting")
            | Opt(config.benchmarkSamples, "samples")
            ["--benchmark-samples"]
        ("number of samples to collect (default: 100)")
            | Opt(config.benchmarkResamples, "resamples")
            ["--benchmark-resamples"]
        ("number of resamples for the bootstrap (default: 100000)")
            | Opt(config.benchmarkConfidenceInterval, "confidence interval")
            ["--benchmark-confidence-interval"]
        ("confidence interval for the bootstrap (between 0 and 1, default: 0.95)")
            | Opt(config.benchmarkNoAnalysis)
            ["--benchmark-no-analysis"]
        ("perform only measurements; do not perform any analysis")
            | Opt(config.benchmarkWarmupTime, "benchmarkWarmupTime")
            ["--benchmark-warmup-time"]
        ("amount of time in milliseconds spent on warming up each test (default: 100)")
            | Arg(config.testsOrTags, "test name|pattern|tags")
            ("which test or tests to use");

        return cli;
    }